

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_session.cc
# Opt level: O3

bool bssl::ssl_session_is_context_valid(SSL_HANDSHAKE *hs,SSL_SESSION *session)

{
  byte bVar1;
  CERT *pCVar2;
  int iVar3;
  
  if (session != (SSL_SESSION *)0x0) {
    bVar1 = (session->sid_ctx).size_;
    pCVar2 = (hs->config->cert)._M_t.super___uniq_ptr_impl<bssl::CERT,_bssl::internal::Deleter>._M_t
             .super__Tuple_impl<0UL,_bssl::CERT_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_bssl::CERT_*,_false>._M_head_impl;
    if (bVar1 == (pCVar2->sid_ctx).size_) {
      if ((ulong)bVar1 != 0) {
        iVar3 = bcmp(&session->sid_ctx,&pCVar2->sid_ctx,(ulong)bVar1);
        return iVar3 == 0;
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool ssl_session_is_context_valid(const SSL_HANDSHAKE *hs,
                                  const SSL_SESSION *session) {
  return session != nullptr &&
         Span(session->sid_ctx) == hs->config->cert->sid_ctx;
}